

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O3

vector<double,_std::allocator<double>_> *
Util::EigenVec2Std(vector<double,_std::allocator<double>_> *__return_storage_ptr__,VectorXd *vec1)

{
  double *pdVar1;
  pointer pdVar2;
  ulong uVar3;
  uint uVar4;
  allocator_type local_29;
  value_type_conflict1 local_28;
  
  uVar4 = (uint)(vec1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  local_28 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(int)uVar4,&local_28,&local_29);
  if (0 < (int)uVar4) {
    pdVar1 = (vec1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      pdVar2[uVar3] = pdVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> EigenVec2Std(Eigen::VectorXd vec1){
		
		//locals
		int n = vec1.size();
		std::vector<double> vec2(n,0);

		//loop
		for (int ii = 0; ii < n; ++ii){
			vec2[ii] = vec1[ii];
		}

		//output
		return vec2;
	}